

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::ComputeBuiltinVarCase::ComputeBuiltinVarCase
          (ComputeBuiltinVarCase *this,Context *context,char *name,char *varName,DataType varType)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_21;
  
  TestCase::TestCase(&this->super_TestCase,context,name,varName);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_00a1ce18;
  (this->m_subCases).
  super__Vector_base<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_subCases).
  super__Vector_base<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_subCases).
  super__Vector_base<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_varName,varName,&local_21);
  this->m_varType = varType;
  p_Var1 = &(this->m_progMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_progMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_progMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_progMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_progMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_progMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_subCaseNdx = 0;
  return;
}

Assistant:

ComputeBuiltinVarCase::ComputeBuiltinVarCase (Context& context, const char* name, const char* varName, DataType varType)
	: TestCase		(context, name, varName)
	, m_varName		(varName)
	, m_varType		(varType)
	, m_subCaseNdx	(0)
{
}